

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1-server.c
# Opt level: O0

void ssh1_login_server_process_queue(PacketProtocolLayer *ppl)

{
  LogContext *pLVar1;
  Ssh *pSVar2;
  ptrlen username;
  ptrlen username_00;
  ptrlen username_01;
  ptrlen username_02;
  ptrlen username_03;
  _Bool _Var3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ssh1_login_server_state *s_00;
  toplevel_callback_fn_t p_Var8;
  PrimeGenerationContext *pgc_00;
  unsigned_long uVar9;
  strbuf *outbuf;
  size_t sVar10;
  size_t sVar11;
  BinaryPacketProtocol *pBVar12;
  PktOut *pPVar13;
  void *pvVar14;
  mp_int *pmVar15;
  RSAKey *pRVar16;
  mp_int *lo;
  mp_int *x;
  uchar *puVar17;
  ssh_hash *h_00;
  PktIn *pPVar18;
  char *pcVar19;
  char *pcVar20;
  undefined4 uVar21;
  ptrlen pVar22;
  ptrlen pVar23;
  ssh_cipheralg *local_190;
  PacketProtocolLayer *successor;
  ptrlen response_1;
  uint response_type;
  char *challenge;
  ptrlen expected;
  ptrlen response;
  mp_int *bn;
  ssh_hash *h;
  uchar *rsabuf;
  mp_int *fake_challenge;
  mp_int *zero;
  mp_int *modulus;
  char *nul;
  ptrlen password;
  PktOutQueue *local_b8;
  ssh_cipheralg *cipher;
  strbuf *data;
  RSAKey *larger;
  RSAKey *smaller;
  void *local_70;
  void *local_68;
  ptrlen client_cookie;
  ProgressReceiver null_progress;
  PrimeGenerationContext *pgc;
  int server_key_bits;
  int *crLine;
  int i;
  PktOut *pktout;
  PktIn *pktin;
  ssh1_login_server_state *s;
  PacketProtocolLayer *ppl_local;
  
  s_00 = (ssh1_login_server_state *)(ppl + -2);
  _Var3 = ssh1_login_server_filter_queue(s_00);
  if (_Var3) {
    return;
  }
  iVar7 = s_00->crState;
  if (iVar7 == 0) {
    if (ppl[-1].ic_process_queue.fn == (toplevel_callback_fn_t)0x0) {
      pgc._4_4_ = *(int *)((long)ppl[-1].ic_process_queue.ctx + 4) + -0x100;
      if (pgc._4_4_ < 0x200) {
        pgc._4_4_ = *(int *)((long)ppl[-1].ic_process_queue.ctx + 4) + 0x100;
      }
      p_Var8 = (toplevel_callback_fn_t)safemalloc(1,0x48,0);
      ppl[-1].ic_process_queue.fn = p_Var8;
      pgc_00 = primegen_new_context(&primegen_probabilistic);
      client_cookie.len = (size_t)&null_progress_vt;
      rsa_generate((RSAKey *)ppl[-1].ic_process_queue.fn,pgc._4_4_,false,pgc_00,
                   (ProgressReceiver *)&client_cookie.len);
      primegen_free_context(pgc_00);
      *(undefined8 *)(ppl[-1].ic_process_queue.fn + 0x38) = 0;
      ppl[-1].ic_process_queue.queued = true;
    }
    *(undefined4 *)((long)&ppl[-2].out_pq + 4) = 0;
    ppl[-2].ic_process_queue.fn = (toplevel_callback_fn_t)ppl[-2].in_pq[3].pqb.end.prev;
    ppl[-2].ic_process_queue.ctx = (void *)0x0;
    uVar6 = auth_methods((AuthPolicy *)ppl[-1].logctx);
    *(uint *)&ppl[-1].seat = uVar6;
    if (((ulong)ppl[-1].seat & 2) != 0) {
      ppl[-2].ic_process_queue.ctx = (void *)((ulong)ppl[-2].ic_process_queue.ctx | 8);
    }
    if (((ulong)ppl[-1].seat & 4) != 0) {
      ppl[-2].ic_process_queue.ctx = (void *)((ulong)ppl[-2].ic_process_queue.ctx | 4);
    }
    if (((ulong)ppl[-1].seat & 0x10) != 0) {
      ppl[-2].ic_process_queue.ctx = (void *)((ulong)ppl[-2].ic_process_queue.ctx | 0x20);
    }
    if (((ulong)ppl[-1].seat & 0x20) != 0) {
      ppl[-2].ic_process_queue.ctx = (void *)((ulong)ppl[-2].ic_process_queue.ctx | 0x10000);
    }
    random_read(&ppl[-2].ic_process_queue.field_0x14,8);
    pPVar13 = ssh_bpp_new_pktout(ppl->bpp,2);
    BinarySink_put_data(pPVar13->binarysink_,&ppl[-2].ic_process_queue.field_0x14,8);
    rsa_ssh1_public_blob
              (pPVar13->binarysink_,(RSAKey *)ppl[-1].ic_process_queue.fn,RSA_SSH1_EXPONENT_FIRST);
    rsa_ssh1_public_blob
              (pPVar13->binarysink_,(RSAKey *)ppl[-1].ic_process_queue.ctx,RSA_SSH1_EXPONENT_FIRST);
    BinarySink_put_uint32(pPVar13->binarysink_,(long)*(int *)((long)&ppl[-2].out_pq + 4));
    BinarySink_put_uint32(pPVar13->binarysink_,(unsigned_long)ppl[-2].ic_process_queue.fn);
    BinarySink_put_uint32(pPVar13->binarysink_,(unsigned_long)ppl[-2].ic_process_queue.ctx);
    pq_base_push(&ppl->out_pq->pqb,&pPVar13->qnode);
    s_00->crState = 0xaf;
  }
  else if (iVar7 != 0xaf) {
    if (iVar7 != 0xfd) {
      if (iVar7 == 0x110) goto LAB_00145809;
      if (iVar7 == 0x164) goto LAB_00145c7a;
      if (iVar7 == 0x192) goto LAB_00145e9d;
      s_00->crState = 0;
      return;
    }
    goto LAB_0014567d;
  }
  pPVar18 = ssh1_login_server_pop(s_00);
  if (pPVar18 == (PktIn *)0x0) {
    return;
  }
  if (pPVar18->type != 3) {
    pSVar2 = ppl->ssh;
    uVar6 = pPVar18->type;
    pcVar19 = ssh1_pkt_type(pPVar18->type);
    ssh_proto_error(pSVar2,
                    "Received unexpected packet in response to initial public key packet, type %d (%s)"
                    ,(ulong)uVar6,pcVar19);
    return;
  }
  bVar4 = BinarySource_get_byte(pPVar18->binarysource_);
  *(uint *)&ppl[-2].ic_process_queue.queued = (uint)bVar4;
  pVar23 = BinarySource_get_data(pPVar18->binarysource_,8);
  local_70 = pVar23.ptr;
  local_68 = (void *)pVar23.len;
  client_cookie.ptr = local_68;
  pmVar15 = BinarySource_get_mp_ssh1(pPVar18->binarysource_);
  ppl[-1].selfptr = (PacketProtocolLayer **)pmVar15;
  uVar9 = BinarySource_get_uint32(pPVar18->binarysource_);
  *(int *)&ppl[-2].out_pq = (int)uVar9;
  if (pPVar18->binarysource_[0].err != BSE_NO_ERROR) {
    ssh_proto_error(ppl->ssh,"Unable to parse session key packet");
    return;
  }
  pVar22 = make_ptrlen(&ppl[-2].ic_process_queue.field_0x14,8);
  pVar23.len = (size_t)client_cookie.ptr;
  pVar23.ptr = local_70;
  _Var3 = ptrlen_eq_ptrlen(pVar23,pVar22);
  if (!_Var3) {
    ssh_proto_error(ppl->ssh,"Client sent incorrect anti-spoofing cookie");
    return;
  }
  if ((0x1f < *(uint *)&ppl[-2].ic_process_queue.queued) ||
     (((ulong)ppl[-2].ic_process_queue.fn >>
       ((byte)*(undefined4 *)&ppl[-2].ic_process_queue.queued & 0x3f) & 1) == 0)) {
    ssh_proto_error(ppl->ssh,"Client selected an unsupported cipher");
    return;
  }
  outbuf = strbuf_new_nm();
  sVar10 = mp_get_nbits(*(mp_int **)((long)ppl[-1].ic_process_queue.ctx + 8));
  sVar11 = mp_get_nbits(*(mp_int **)(ppl[-1].ic_process_queue.fn + 8));
  if (sVar11 < sVar10) {
    data = (strbuf *)ppl[-1].ic_process_queue.ctx;
    larger = (RSAKey *)ppl[-1].ic_process_queue.fn;
  }
  else {
    larger = (RSAKey *)ppl[-1].ic_process_queue.ctx;
    data = (strbuf *)ppl[-1].ic_process_queue.fn;
  }
  _Var3 = rsa_ssh1_decrypt_pkcs1((mp_int *)ppl[-1].selfptr,(RSAKey *)data,outbuf);
  if (_Var3) {
    mp_free((mp_int *)ppl[-1].selfptr);
    pVar23 = ptrlen_from_strbuf(outbuf);
    pmVar15 = mp_from_bytes_be(pVar23);
    ppl[-1].selfptr = (PacketProtocolLayer **)pmVar15;
    strbuf_clear(outbuf);
    _Var3 = rsa_ssh1_decrypt_pkcs1((mp_int *)ppl[-1].selfptr,larger,outbuf);
    if ((_Var3) && (outbuf->len == 0x20)) {
      puVar17 = outbuf->u;
      *(undefined8 *)((long)&ppl[-2].selfptr + 4) = *(undefined8 *)puVar17;
      *(undefined8 *)((long)&ppl[-2].logctx + 4) = *(undefined8 *)(puVar17 + 8);
      *(undefined8 *)((long)&ppl[-2].seat + 4) = *(undefined8 *)(puVar17 + 0x10);
      *(undefined8 *)((long)&ppl[-2].interactor + 4) = *(undefined8 *)(puVar17 + 0x18);
      mp_free((mp_int *)ppl[-1].selfptr);
      ppl[-1].selfptr = (PacketProtocolLayer **)0x0;
    }
  }
  strbuf_free(outbuf);
  if (ppl[-1].selfptr != (PacketProtocolLayer **)0x0) {
    ssh_proto_error(ppl->ssh,"Failed to decrypt session key");
    return;
  }
  ssh1_compute_session_id
            ((uchar *)((long)&ppl[-2].ssh + 4),&ppl[-2].ic_process_queue.field_0x14,
             (RSAKey *)ppl[-1].ic_process_queue.ctx,(RSAKey *)ppl[-1].ic_process_queue.fn);
  for (crLine._4_4_ = 0; crLine._4_4_ < 0x10; crLine._4_4_ = crLine._4_4_ + 1) {
    *(byte *)((long)ppl + (long)crLine._4_4_ + -0x94) =
         *(byte *)((long)ppl + (long)crLine._4_4_ + -0x94) ^
         *(byte *)((long)ppl + (long)crLine._4_4_ + -0x74);
  }
  if (*(int *)&ppl[-2].ic_process_queue.queued == 6) {
    local_190 = &ssh_blowfish_ssh1;
  }
  else {
    local_190 = &ssh_3des_ssh1;
    if (*(int *)&ppl[-2].ic_process_queue.queued == 2) {
      local_190 = &ssh_des;
    }
  }
  ssh1_bpp_new_cipher(ppl->bpp,local_190,(void *)((long)&ppl[-2].selfptr + 4));
  pPVar13 = ssh_bpp_new_pktout(ppl->bpp,0xe);
  pq_base_push(&ppl->out_pq->pqb,&pPVar13->qnode);
  s_00->crState = 0xfd;
LAB_0014567d:
  pPVar18 = ssh1_login_server_pop(s_00);
  if (pPVar18 != (PktIn *)0x0) {
    if (pPVar18->type == 4) {
      pVar23 = BinarySource_get_string(pPVar18->binarysource_);
      password.len = (size_t)pVar23.ptr;
      ppl[-1].in_pq = (PktInQueue *)password.len;
      local_b8 = (PktOutQueue *)pVar23.len;
      ppl[-1].out_pq = local_b8;
      pVar22.ptr = ppl[-1].in_pq;
      pVar22.len = (size_t)ppl[-1].out_pq;
      pBVar12 = (BinaryPacketProtocol *)mkstr(pVar22);
      ppl[-1].bpp = pBVar12;
      ppl[-1].in_pq = (PktInQueue *)pBVar12;
      pLVar1 = ppl->logctx;
      uVar6 = string_length_for_printf((size_t)ppl[-1].out_pq);
      pcVar19 = dupprintf("Received username \'%.*s\'",(ulong)uVar6,ppl[-1].in_pq);
      logevent_and_free(pLVar1,pcVar19);
      username.ptr = ppl[-1].in_pq;
      username.len = (size_t)ppl[-1].out_pq;
      bVar5 = auth_none((AuthPolicy *)ppl[-1].logctx,username);
      while (!bVar5) {
LAB_001457ce:
        while( true ) {
          pPVar13 = ssh_bpp_new_pktout(ppl->bpp,0xf);
          pq_base_push(&ppl->out_pq->pqb,&pPVar13->qnode);
          s_00->crState = 0x110;
LAB_00145809:
          pPVar18 = ssh1_login_server_pop(s_00);
          if (pPVar18 == (PktIn *)0x0) {
            return;
          }
          if (pPVar18->type != 9) break;
          *(undefined4 *)((long)&ppl[-1].seat + 4) = 2;
          if ((*(uint *)&ppl[-1].seat & *(uint *)((long)&ppl[-1].seat + 4)) != 0) {
            _nul = BinarySource_get_string(pPVar18->binarysource_);
            pvVar14 = memchr(nul,0,(size_t)password.ptr);
            if (pvVar14 != (void *)0x0) {
              password.ptr = (void *)((long)pvVar14 - (long)nul);
            }
            username_00.ptr = ppl[-1].in_pq;
            username_00.len = (size_t)ppl[-1].out_pq;
            iVar7 = auth_password((AuthPolicy *)ppl[-1].logctx,username_00,_nul,(ptrlen *)0x0);
            if (iVar7 != 0) goto LAB_00145fc6;
          }
        }
        if (pPVar18->type == 6) {
          *(undefined4 *)((long)&ppl[-1].seat + 4) = 4;
          if ((*(uint *)&ppl[-1].seat & *(uint *)((long)&ppl[-1].seat + 4)) == 0) goto LAB_001457ce;
          pmVar15 = BinarySource_get_mp_ssh1(pPVar18->binarysource_);
          username_01.ptr = ppl[-1].in_pq;
          username_01.len = (size_t)ppl[-1].out_pq;
          pRVar16 = auth_publickey_ssh1((AuthPolicy *)ppl[-1].logctx,username_01,pmVar15);
          *(RSAKey **)&ppl[-1].remote_bugs = pRVar16;
          if ((*(long *)&ppl[-1].remote_bugs == 0) &&
             ((ppl[-2].in_pq[3].pqb.end.formal_size & 0x10000) != 0)) {
            lo = mp_from_integer(0);
            x = mp_random_in_range_fn(lo,pmVar15,random_read);
            pPVar13 = ssh_bpp_new_pktout(ppl->bpp,7);
            BinarySink_put_mp_ssh1(pPVar13->binarysink_,x);
            pq_base_push(&ppl->out_pq->pqb,&pPVar13->qnode);
            mp_free(lo);
            mp_free(x);
          }
          mp_free(pmVar15);
          if ((*(long *)&ppl[-1].remote_bugs != 0) ||
             ((ppl[-2].in_pq[3].pqb.end.formal_size & 0x10000) != 0)) {
            if ((*(long *)&ppl[-1].remote_bugs == 0) ||
               (0x1f < *(int *)(*(long *)&ppl[-1].remote_bugs + 4))) {
              if (*(long *)&ppl[-1].remote_bugs != 0) {
                puVar17 = (uchar *)safemalloc((long)*(int *)(*(long *)&ppl[-1].remote_bugs + 4),1,0)
                ;
                random_read(puVar17,0x20);
                h_00 = ssh_hash_new(&ssh_md5);
                BinarySink_put_data(h_00->binarysink_,puVar17,0x20);
                BinarySink_put_data(h_00->binarysink_,(void *)((long)&ppl[-2].ssh + 4),0x10);
                ssh_hash_final(h_00,(uchar *)&ppl[-1].interactor);
                _Var3 = rsa_ssh1_encrypt(puVar17,0x20,*(RSAKey **)&ppl[-1].remote_bugs);
                if (!_Var3) {
                  safefree(puVar17);
                  pLVar1 = ppl->logctx;
                  pcVar19 = dupprintf("Failed to encrypt auth challenge");
                  logevent_and_free(pLVar1,pcVar19);
                  goto LAB_001457ce;
                }
                pVar23 = make_ptrlen(puVar17,(long)*(int *)(*(long *)&ppl[-1].remote_bugs + 4));
                pmVar15 = mp_from_bytes_be(pVar23);
                smemclr(puVar17,(long)*(int *)(*(long *)&ppl[-1].remote_bugs + 4));
                safefree(puVar17);
                pPVar13 = ssh_bpp_new_pktout(ppl->bpp,7);
                BinarySink_put_mp_ssh1(pPVar13->binarysink_,pmVar15);
                pq_base_push(&ppl->out_pq->pqb,&pPVar13->qnode);
                mp_free(pmVar15);
              }
              s_00->crState = 0x164;
LAB_00145c7a:
              pPVar18 = ssh1_login_server_pop(s_00);
              if (pPVar18 == (PktIn *)0x0) {
                return;
              }
              if (pPVar18->type != 8) {
                pSVar2 = ppl->ssh;
                uVar6 = pPVar18->type;
                pcVar19 = ssh1_pkt_type(pPVar18->type);
                ssh_proto_error(pSVar2,
                                "Received unexpected packet in response to RSA auth challenge, type %d (%s)"
                                ,(ulong)uVar6,pcVar19);
                return;
              }
              if (*(long *)&ppl[-1].remote_bugs != 0) {
                pVar23 = BinarySource_get_data(pPVar18->binarysource_,0x10);
                pVar22 = make_ptrlen(&ppl[-1].interactor,0x10);
                _Var3 = ptrlen_eq_ptrlen(pVar23,pVar22);
                if (_Var3) break;
                pLVar1 = ppl->logctx;
                pcVar19 = dupprintf("Wrong response to auth challenge");
                logevent_and_free(pLVar1,pcVar19);
              }
              goto LAB_001457ce;
            }
            pLVar1 = ppl->logctx;
            pcVar19 = dupprintf("Auth key far too small");
            logevent_and_free(pLVar1,pcVar19);
          }
          goto LAB_001457ce;
        }
        if ((pPVar18->type != 0x27) && (pPVar18->type != 0x46)) goto LAB_001457ce;
        uVar21 = 0x20;
        if (pPVar18->type == 0x27) {
          uVar21 = 0x10;
        }
        *(undefined4 *)((long)&ppl[-1].seat + 4) = uVar21;
        if (((*(uint *)&ppl[-1].seat & *(uint *)((long)&ppl[-1].seat + 4)) == 0) ||
           (username_02.ptr = ppl[-1].in_pq, username_02.len = (size_t)ppl[-1].out_pq,
           pcVar19 = auth_ssh1int_challenge
                               ((AuthPolicy *)ppl[-1].logctx,*(uint *)((long)&ppl[-1].seat + 4),
                                username_02), pcVar19 == (char *)0x0)) goto LAB_001457ce;
        iVar7 = 0x47;
        if (*(int *)((long)&ppl[-1].seat + 4) == 0x10) {
          iVar7 = 0x28;
        }
        pPVar13 = ssh_bpp_new_pktout(ppl->bpp,iVar7);
        BinarySink_put_stringz(pPVar13->binarysink_,pcVar19);
        pq_base_push(&ppl->out_pq->pqb,&pPVar13->qnode);
        safefree(pcVar19);
        s_00->crState = 0x192;
LAB_00145e9d:
        pPVar18 = ssh1_login_server_pop(s_00);
        if (pPVar18 == (PktIn *)0x0) {
          return;
        }
        iVar7 = 0x48;
        if (*(int *)((long)&ppl[-1].seat + 4) == 0x10) {
          iVar7 = 0x29;
        }
        if (pPVar18->type != iVar7) {
          pSVar2 = ppl->ssh;
          pcVar19 = "CryptoCard";
          if (*(int *)((long)&ppl[-1].seat + 4) == 0x10) {
            pcVar19 = "TIS";
          }
          uVar6 = pPVar18->type;
          pcVar20 = ssh1_pkt_type(pPVar18->type);
          ssh_proto_error(pSVar2,
                          "Received unexpected packet in response to %s challenge, type %d (%s)",
                          pcVar19,(ulong)uVar6,pcVar20);
          return;
        }
        pVar23 = BinarySource_get_string(pPVar18->binarysource_);
        bVar5 = auth_ssh1int_response((AuthPolicy *)ppl[-1].logctx,pVar23);
      }
LAB_00145fc6:
      username_03.ptr = ppl[-1].in_pq;
      username_03.len = (size_t)ppl[-1].out_pq;
      _Var3 = auth_successful((AuthPolicy *)ppl[-1].logctx,username_03,
                              *(uint *)((long)&ppl[-1].seat + 4));
      if (_Var3) {
        pPVar13 = ssh_bpp_new_pktout(ppl->bpp,0xe);
        pq_base_push(&ppl->out_pq->pqb,&pPVar13->qnode);
        ssh1_connection_set_protoflags
                  ((PacketProtocolLayer *)ppl[-2].bpp,*(int *)((long)&ppl[-2].out_pq + 4),
                   *(int *)&ppl[-2].out_pq);
        pBVar12 = ppl[-2].bpp;
        ppl[-2].bpp = (BinaryPacketProtocol *)0x0;
        ssh_ppl_replace(ppl,(PacketProtocolLayer *)pBVar12);
      }
      else {
        ssh_sw_abort(ppl->ssh,"Multiple authentications required but SSH-1 cannot perform them");
      }
    }
    else {
      pSVar2 = ppl->ssh;
      uVar6 = pPVar18->type;
      pcVar19 = ssh1_pkt_type(pPVar18->type);
      ssh_proto_error(pSVar2,"Received unexpected packet while expecting username, type %d (%s)",
                      (ulong)uVar6,pcVar19);
    }
  }
  return;
}

Assistant:

static void ssh1_login_server_process_queue(PacketProtocolLayer *ppl)
{
    struct ssh1_login_server_state *s =
        container_of(ppl, struct ssh1_login_server_state, ppl);
    PktIn *pktin;
    PktOut *pktout;
    int i;

    /* Filter centrally handled messages off the front of the queue on
     * every entry to this coroutine, no matter where we're resuming
     * from, even if we're _not_ looping on pq_pop. That way we can
     * still proactively handle those messages even if we're waiting
     * for a user response. */
    if (ssh1_login_server_filter_queue(s))
        return;

    crBegin(s->crState);

    if (!s->servkey) {
        int server_key_bits = s->hostkey->bytes - 256;
        if (server_key_bits < 512)
            server_key_bits = s->hostkey->bytes + 256;
        s->servkey = snew(RSAKey);

        PrimeGenerationContext *pgc = primegen_new_context(
            &primegen_probabilistic);
        ProgressReceiver null_progress;
        null_progress.vt = &null_progress_vt;
        rsa_generate(s->servkey, server_key_bits, false, pgc, &null_progress);
        primegen_free_context(pgc);

        s->servkey->comment = NULL;
        s->servkey_generated_here = true;
    }

    s->local_protoflags = SSH1_PROTOFLAGS_SUPPORTED;
    s->supported_ciphers_mask = s->ssc->ssh1_cipher_mask;
    s->supported_auths_mask = 0;
    s->ap_methods = auth_methods(s->authpolicy);
    if (s->ap_methods & AUTHMETHOD_PASSWORD)
        s->supported_auths_mask |= (1U << SSH1_AUTH_PASSWORD);
    if (s->ap_methods & AUTHMETHOD_PUBLICKEY)
        s->supported_auths_mask |= (1U << SSH1_AUTH_RSA);
    if (s->ap_methods & AUTHMETHOD_TIS)
        s->supported_auths_mask |= (1U << SSH1_AUTH_TIS);
    if (s->ap_methods & AUTHMETHOD_CRYPTOCARD)
        s->supported_auths_mask |= (1U << SSH1_AUTH_CCARD);

    random_read(s->cookie, 8);

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_PUBLIC_KEY);
    put_data(pktout, s->cookie, 8);
    rsa_ssh1_public_blob(BinarySink_UPCAST(pktout),
                         s->servkey, RSA_SSH1_EXPONENT_FIRST);
    rsa_ssh1_public_blob(BinarySink_UPCAST(pktout),
                         s->hostkey, RSA_SSH1_EXPONENT_FIRST);
    put_uint32(pktout, s->local_protoflags);
    put_uint32(pktout, s->supported_ciphers_mask);
    put_uint32(pktout, s->supported_auths_mask);
    pq_push(s->ppl.out_pq, pktout);

    crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
    if (pktin->type != SSH1_CMSG_SESSION_KEY) {
        ssh_proto_error(s->ppl.ssh, "Received unexpected packet in response"
                        " to initial public key packet, type %d (%s)",
                        pktin->type, ssh1_pkt_type(pktin->type));
        return;
    }

    {
        ptrlen client_cookie;
        s->cipher_type = get_byte(pktin);
        client_cookie = get_data(pktin, 8);
        s->sesskey = get_mp_ssh1(pktin);
        s->remote_protoflags = get_uint32(pktin);

        if (get_err(pktin)) {
            ssh_proto_error(s->ppl.ssh, "Unable to parse session key packet");
            return;
        }
        if (!ptrlen_eq_ptrlen(client_cookie, make_ptrlen(s->cookie, 8))) {
            ssh_proto_error(s->ppl.ssh,
                            "Client sent incorrect anti-spoofing cookie");
            return;
        }
    }
    if (s->cipher_type >= 32 ||
        !((s->supported_ciphers_mask >> s->cipher_type) & 1)) {
        ssh_proto_error(s->ppl.ssh, "Client selected an unsupported cipher");
        return;
    }

    {
        RSAKey *smaller, *larger;
        strbuf *data = strbuf_new_nm();

        if (mp_get_nbits(s->hostkey->modulus) >
            mp_get_nbits(s->servkey->modulus)) {
            larger = s->hostkey;
            smaller = s->servkey;
        } else {
            smaller = s->hostkey;
            larger = s->servkey;
        }

        if (rsa_ssh1_decrypt_pkcs1(s->sesskey, larger, data)) {
            mp_free(s->sesskey);
            s->sesskey = mp_from_bytes_be(ptrlen_from_strbuf(data));
            strbuf_clear(data);
            if (rsa_ssh1_decrypt_pkcs1(s->sesskey, smaller, data) &&
                data->len == sizeof(s->session_key)) {
                memcpy(s->session_key, data->u, sizeof(s->session_key));
                mp_free(s->sesskey);
                s->sesskey = NULL;     /* indicates success */
            }
        }

        strbuf_free(data);
    }
    if (s->sesskey) {
        ssh_proto_error(s->ppl.ssh, "Failed to decrypt session key");
        return;
    }

    ssh1_compute_session_id(s->session_id, s->cookie, s->hostkey, s->servkey);

    for (i = 0; i < 16; i++)
        s->session_key[i] ^= s->session_id[i];

    {
        const ssh_cipheralg *cipher =
            (s->cipher_type == SSH1_CIPHER_BLOWFISH ? &ssh_blowfish_ssh1 :
             s->cipher_type == SSH1_CIPHER_DES ? &ssh_des : &ssh_3des_ssh1);
        ssh1_bpp_new_cipher(s->ppl.bpp, cipher, s->session_key);
    }

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_SUCCESS);
    pq_push(s->ppl.out_pq, pktout);

    crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
    if (pktin->type != SSH1_CMSG_USER) {
        ssh_proto_error(s->ppl.ssh, "Received unexpected packet while "
                        "expecting username, type %d (%s)",
                        pktin->type, ssh1_pkt_type(pktin->type));
        return;
    }
    s->username = get_string(pktin);
    s->username.ptr = s->username_str = mkstr(s->username);
    ppl_logevent("Received username '%.*s'", PTRLEN_PRINTF(s->username));

    if (auth_none(s->authpolicy, s->username))
        goto auth_success;

    while (1) {
        /* Signal failed authentication */
        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_FAILURE);
        pq_push(s->ppl.out_pq, pktout);

        crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
        if (pktin->type == SSH1_CMSG_AUTH_PASSWORD) {
            s->current_method = AUTHMETHOD_PASSWORD;
            if (!(s->ap_methods & s->current_method))
                continue;

            ptrlen password = get_string(pktin);

            /* Tolerate historic traffic-analysis defence of NUL +
             * garbage on the end of the binary password string */
            char *nul = memchr(password.ptr, '\0', password.len);
            if (nul)
                password.len = (const char *)nul - (const char *)password.ptr;

            if (auth_password(s->authpolicy, s->username, password, NULL))
                goto auth_success;
        } else if (pktin->type == SSH1_CMSG_AUTH_RSA) {
            s->current_method = AUTHMETHOD_PUBLICKEY;
            if (!(s->ap_methods & s->current_method))
                continue;

            {
                mp_int *modulus = get_mp_ssh1(pktin);
                s->authkey = auth_publickey_ssh1(
                    s->authpolicy, s->username, modulus);

                if (!s->authkey &&
                    s->ssc->stunt_pretend_to_accept_any_pubkey) {
                    mp_int *zero = mp_from_integer(0);
                    mp_int *fake_challenge = mp_random_in_range(zero, modulus);

                    pktout = ssh_bpp_new_pktout(
                        s->ppl.bpp, SSH1_SMSG_AUTH_RSA_CHALLENGE);
                    put_mp_ssh1(pktout, fake_challenge);
                    pq_push(s->ppl.out_pq, pktout);

                    mp_free(zero);
                    mp_free(fake_challenge);
                }

                mp_free(modulus);
            }

            if (!s->authkey &&
                !s->ssc->stunt_pretend_to_accept_any_pubkey)
                continue;

            if (s->authkey && s->authkey->bytes < 32) {
                ppl_logevent("Auth key far too small");
                continue;
            }

            if (s->authkey) {
                unsigned char *rsabuf =
                    snewn(s->authkey->bytes, unsigned char);

                random_read(rsabuf, 32);

                {
                    ssh_hash *h = ssh_hash_new(&ssh_md5);
                    put_data(h, rsabuf, 32);
                    put_data(h, s->session_id, 16);
                    ssh_hash_final(h, s->auth_rsa_expected_response);
                }

                if (!rsa_ssh1_encrypt(rsabuf, 32, s->authkey)) {
                    sfree(rsabuf);
                    ppl_logevent("Failed to encrypt auth challenge");
                    continue;
                }

                mp_int *bn = mp_from_bytes_be(
                    make_ptrlen(rsabuf, s->authkey->bytes));
                smemclr(rsabuf, s->authkey->bytes);
                sfree(rsabuf);

                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH1_SMSG_AUTH_RSA_CHALLENGE);
                put_mp_ssh1(pktout, bn);
                pq_push(s->ppl.out_pq, pktout);

                mp_free(bn);
            }

            crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
            if (pktin->type != SSH1_CMSG_AUTH_RSA_RESPONSE) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet in "
                                "response to RSA auth challenge, type %d (%s)",
                                pktin->type, ssh1_pkt_type(pktin->type));
                return;
            }

            if (!s->authkey)
                continue;

            {
                ptrlen response = get_data(pktin, 16);
                ptrlen expected = make_ptrlen(
                    s->auth_rsa_expected_response, 16);
                if (!ptrlen_eq_ptrlen(response, expected)) {
                    ppl_logevent("Wrong response to auth challenge");
                    continue;
                }
            }

            goto auth_success;
        } else if (pktin->type == SSH1_CMSG_AUTH_TIS ||
                   pktin->type == SSH1_CMSG_AUTH_CCARD) {
            char *challenge;
            unsigned response_type;
            ptrlen response;

            s->current_method = (pktin->type == SSH1_CMSG_AUTH_TIS ?
                                 AUTHMETHOD_TIS : AUTHMETHOD_CRYPTOCARD);
            if (!(s->ap_methods & s->current_method))
                continue;

            challenge = auth_ssh1int_challenge(
                s->authpolicy, s->current_method, s->username);
            if (!challenge)
                continue;
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp,
                (s->current_method == AUTHMETHOD_TIS ?
                 SSH1_SMSG_AUTH_TIS_CHALLENGE :
                 SSH1_SMSG_AUTH_CCARD_CHALLENGE));
            put_stringz(pktout, challenge);
            pq_push(s->ppl.out_pq, pktout);
            sfree(challenge);

            crMaybeWaitUntilV((pktin = ssh1_login_server_pop(s)) != NULL);
            response_type = (s->current_method == AUTHMETHOD_TIS ?
                             SSH1_CMSG_AUTH_TIS_RESPONSE :
                             SSH1_CMSG_AUTH_CCARD_RESPONSE);
            if (pktin->type != response_type) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet in "
                                "response to %s challenge, type %d (%s)",
                                (s->current_method == AUTHMETHOD_TIS ?
                                 "TIS" : "CryptoCard"),
                                pktin->type, ssh1_pkt_type(pktin->type));
                return;
            }

            response = get_string(pktin);

            if (auth_ssh1int_response(s->authpolicy, response))
                goto auth_success;
        }
    }

  auth_success:
    if (!auth_successful(s->authpolicy, s->username, s->current_method)) {
        ssh_sw_abort(s->ppl.ssh, "Multiple authentications required but SSH-1"
                     " cannot perform them");
        return;
    }

    /* Signal successful authentication */
    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_SMSG_SUCCESS);
    pq_push(s->ppl.out_pq, pktout);

    ssh1_connection_set_protoflags(
        s->successor_layer, s->local_protoflags, s->remote_protoflags);
    {
        PacketProtocolLayer *successor = s->successor_layer;
        s->successor_layer = NULL;     /* avoid freeing it ourself */
        ssh_ppl_replace(&s->ppl, successor);
        return;   /* we've just freed s, so avoid even touching s->crState */
    }

    crFinishV;
}